

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ptrmapPutOvflPtr(MemPage *pPage,MemPage *pSrc,u8 *pCell,int *pRC)

{
  long lVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Pgno ovfl;
  CellInfo info;
  BtShared *pBt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pBt = (BtShared *)&DAT_aaaaaaaaaaaaaaaa;
  if (*in_RCX == 0) {
    (**(code **)(in_RDI + 0x80))(in_RDI,in_RDX,&stack0xffffffffffffffe0);
    if ((in_RDX < *(int **)(in_RSI + 0x58)) && (*(ulong *)(in_RSI + 0x58) < (long)in_RDX + 0xaaaaU))
    {
      iVar2 = sqlite3CorruptError(0);
      *in_RCX = iVar2;
    }
    else {
      sqlite3Get4byte((u8 *)((long)in_RDX + 0xaaa6));
      ptrmapPut(pBt,(Pgno)((ulong)in_RDI >> 0x20),(u8)((ulong)in_RDI >> 0x18),
                (Pgno)((ulong)in_RSI >> 0x20),in_RDX);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, MemPage *pSrc, u8 *pCell,int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  pPage->xParseCell(pPage, pCell, &info);
  if( info.nLocal<info.nPayload ){
    Pgno ovfl;
    if( SQLITE_OVERFLOW(pSrc->aDataEnd, pCell, pCell+info.nLocal) ){
      testcase( pSrc!=pPage );
      *pRC = SQLITE_CORRUPT_BKPT;
      return;
    }
    ovfl = get4byte(&pCell[info.nSize-4]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}